

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<bool>::~RepeatedField(RepeatedField<bool> *this)

{
  bool *pbVar1;
  void **ppvVar2;
  
  if (this->total_size_ == 0) {
    ppvVar2 = &this->arena_or_elements_;
  }
  else {
    pbVar1 = elements(this);
    ppvVar2 = (void **)(pbVar1 + -8);
  }
  if ((ThreadSafeArena *)*ppvVar2 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)*ppvVar2);
  }
  if (0 < this->total_size_) {
    pbVar1 = elements(this);
    if (*(long *)(pbVar1 + -8) == 0) {
      operator_delete(pbVar1 + -8);
      return;
    }
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
#ifndef NDEBUG
  // Try to trigger segfault / asan failure in non-opt builds. If arena_
  // lifetime has ended before the destructor.
  auto arena = GetArena();
  if (arena) (void)arena->SpaceAllocated();
#endif
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}